

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::InsertSyntheticTestCase(string *name,CodeLocation *location,bool has_test_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  char *__s;
  pointer pcVar4;
  UnitTestImpl *pUVar5;
  _Alloc_hider name_00;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  const_iterator cVar8;
  long *plVar9;
  TestFactoryBase *factory;
  long *plVar10;
  size_type *psVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  string full_name;
  string message;
  char kMissingTestCase [348];
  char kMissingInstantiation [378];
  allocator<char> local_431;
  long *local_430;
  long local_428;
  long local_420;
  long lStack_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  TestFactoryBase *local_3d0;
  undefined8 local_3c8;
  TestFactoryBase local_3c0;
  _func_int **pp_Stack_3b8;
  int local_3b0;
  CodeLocation local_3a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  _func_int **local_378;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  TestFactoryBase *local_360;
  _func_int **local_358;
  TestFactoryBase local_350;
  _func_int **pp_Stack_348;
  int local_340;
  long *local_338;
  long local_330;
  long local_328;
  long lStack_320;
  undefined1 local_318 [352];
  undefined1 local_1b8 [392];
  
  UnitTest::GetInstance();
  pUVar5 = UnitTest::GetInstance::instance.impl_;
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&((UnitTest::GetInstance::instance.impl_)->ignored_parameterized_test_suites_)._M_t
                 ,name);
  if ((_Rb_tree_header *)cVar8._M_node ==
      &(pUVar5->ignored_parameterized_test_suites_)._M_t._M_impl.super__Rb_tree_header) {
    memcpy(local_1b8,
           " is defined via TEST_P, but never instantiated. None of the test cases will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only ones provided expand to nothing.\n\nIdeally, TEST_P definitions should only ever be included as part of binaries that intend to use them. (As opposed to, for example, being placed in a library that may be linked in to get other utilities.)"
           ,0x17a);
    memcpy(local_318,
           " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are defined via TEST_P . No test cases will run.\n\nIdeally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from code that always depend on code that provides TEST_P. Failing to do so is often an indication of dead code, e.g. the last TEST_P was removed but the rest got left behind."
           ,0x15c);
    std::operator+(&local_410,"Parameterized test suite ",name);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_410);
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_420 = *plVar10;
      lStack_418 = plVar9[3];
      local_430 = &local_420;
    }
    else {
      local_420 = *plVar10;
      local_430 = (long *)*plVar9;
    }
    local_428 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_430);
    paVar2 = &local_3a8.file.field_2;
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_3a8.file.field_2._M_allocated_capacity = *psVar11;
      local_3a8.file.field_2._8_8_ = plVar9[3];
      local_3a8.file._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_3a8.file.field_2._M_allocated_capacity = *psVar11;
      local_3a8.file._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_3a8.file._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_3a8,(ulong)(name->_M_dataplus)._M_p);
    paVar1 = &local_3f0.field_2;
    paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 == paVar12) {
      local_3f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_3f0.field_2._8_8_ = plVar9[3];
      local_3f0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_3f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
      local_3f0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_3f0._M_string_length = plVar9[1];
    *plVar9 = (long)paVar12;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_3f0);
    local_338 = &local_328;
    plVar10 = plVar9 + 2;
    if ((long *)*plVar9 == plVar10) {
      local_328 = *plVar10;
      lStack_320 = plVar9[3];
    }
    else {
      local_328 = *plVar10;
      local_338 = (long *)*plVar9;
    }
    local_330 = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.file._M_dataplus._M_p != paVar2) {
      operator_delete(local_3a8.file._M_dataplus._M_p,
                      local_3a8.file.field_2._M_allocated_capacity + 1);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430,local_420 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    std::operator+(&local_3f0,"UninstantiatedParameterizedTestSuite<",name);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_3f0);
    psVar11 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_410.field_2._M_allocated_capacity = *psVar11;
      local_410.field_2._8_8_ = plVar9[3];
      local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    }
    else {
      local_410.field_2._M_allocated_capacity = *psVar11;
      local_410._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_410._M_string_length = plVar9[1];
    *plVar9 = (long)psVar11;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    name_00._M_p = local_410._M_dataplus._M_p;
    __s = (location->file)._M_dataplus._M_p;
    iVar3 = location->line;
    local_380 = &local_370;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_380,local_338,local_330 + (long)local_338);
    pcVar4 = (location->file)._M_dataplus._M_p;
    local_360 = &local_350;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar4,pcVar4 + (location->file)._M_string_length);
    local_340 = location->line;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,__s,&local_431);
    local_3a8.file._M_dataplus._M_p = (pointer)&local_3a8.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3a8,local_430,local_428 + (long)local_430);
    local_3a8.line = iVar3;
    factory = (TestFactoryBase *)operator_new(0x50);
    pp_Var7 = local_358;
    pp_Var6 = local_378;
    if (local_380 == &local_370) {
      local_3f0.field_2._8_8_ = local_370._8_8_;
      local_380 = paVar1;
    }
    local_3f0.field_2._M_allocated_capacity._1_7_ = local_370._M_allocated_capacity._1_7_;
    local_3f0.field_2._M_local_buf[0] = local_370._M_local_buf[0];
    local_378 = (_func_int **)0x0;
    local_370._M_local_buf[0] = '\0';
    if (local_360 == &local_350) {
      pp_Stack_3b8 = pp_Stack_348;
      local_360 = &local_3c0;
    }
    local_3c0._vptr_TestFactoryBase._1_7_ = local_350._vptr_TestFactoryBase._1_7_;
    local_3c0._vptr_TestFactoryBase._0_1_ = local_350._vptr_TestFactoryBase._0_1_;
    local_358 = (_func_int **)0x0;
    local_350._vptr_TestFactoryBase._0_1_ = 0;
    local_3b0 = local_340;
    factory->_vptr_TestFactoryBase =
         (_func_int **)
         (
         _ZTVZN7testing12RegisterTestITpTnRiJEZNS_8internal23InsertSyntheticTestCaseERKNSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEENS2_12CodeLocationEbE3__0EEPNS_8TestInfoEPKcSG_SG_SG_SG_iT0_E11FactoryImpl
         + 0x10);
    factory[1]._vptr_TestFactoryBase = (_func_int **)(factory + 3);
    if (local_380 == paVar1) {
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_3f0.field_2._M_allocated_capacity;
      factory[4]._vptr_TestFactoryBase = (_func_int **)local_3f0.field_2._8_8_;
    }
    else {
      factory[1]._vptr_TestFactoryBase = (_func_int **)local_380;
      factory[3]._vptr_TestFactoryBase = (_func_int **)local_3f0.field_2._M_allocated_capacity;
    }
    factory[2]._vptr_TestFactoryBase = pp_Var6;
    local_3f0._M_string_length = 0;
    local_3f0.field_2._M_allocated_capacity =
         (ulong)(uint7)local_370._M_allocated_capacity._1_7_ << 8;
    factory[5]._vptr_TestFactoryBase = (_func_int **)(factory + 7);
    if (local_360 == &local_3c0) {
      factory[7]._vptr_TestFactoryBase = local_3c0._vptr_TestFactoryBase;
      factory[8]._vptr_TestFactoryBase = pp_Stack_3b8;
    }
    else {
      factory[5]._vptr_TestFactoryBase = (_func_int **)local_360;
      factory[7]._vptr_TestFactoryBase = local_3c0._vptr_TestFactoryBase;
    }
    factory[6]._vptr_TestFactoryBase = pp_Var7;
    local_3c8 = 0;
    local_3c0._vptr_TestFactoryBase =
         (_func_int **)((ulong)local_350._vptr_TestFactoryBase._1_7_ << 8);
    *(int *)&factory[9]._vptr_TestFactoryBase = local_340;
    local_3f0._M_dataplus._M_p = (pointer)paVar1;
    local_3d0 = &local_3c0;
    local_380 = &local_370;
    local_360 = &local_350;
    MakeAndRegisterTestInfo
              ("GoogleTestVerification",name_00._M_p,(char *)0x0,(char *)0x0,&local_3a8,
               &TypeIdHelper<testing::internal::(anonymous_namespace)::FailureTest>::dummy_,
               (SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,factory);
    if (local_3d0 != &local_3c0) {
      operator_delete(local_3d0,(long)local_3c0._vptr_TestFactoryBase + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != paVar1) {
      operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8.file._M_dataplus._M_p != &local_3a8.file.field_2) {
      operator_delete(local_3a8.file._M_dataplus._M_p,
                      local_3a8.file.field_2._M_allocated_capacity + 1);
    }
    if (local_430 != &local_420) {
      operator_delete(local_430,local_420 + 1);
    }
    if (local_360 != &local_350) {
      operator_delete(local_360,
                      CONCAT71(local_350._vptr_TestFactoryBase._1_7_,
                               local_350._vptr_TestFactoryBase._0_1_) + 1);
    }
    if (local_380 != &local_370) {
      operator_delete(local_380,
                      CONCAT71(local_370._M_allocated_capacity._1_7_,local_370._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
    if (local_338 != &local_328) {
      operator_delete(local_338,local_328 + 1);
    }
  }
  return;
}

Assistant:

void InsertSyntheticTestCase(const std::string& name, CodeLocation location,
                             bool has_test_p) {
  const auto& ignored = *GetIgnoredParameterizedTestSuites();
  if (ignored.find(name) != ignored.end()) return;

  const char kMissingInstantiation[] =  //
      " is defined via TEST_P, but never instantiated. None of the test cases "
      "will run. Either no INSTANTIATE_TEST_SUITE_P is provided or the only "
      "ones provided expand to nothing."
      "\n\n"
      "Ideally, TEST_P definitions should only ever be included as part of "
      "binaries that intend to use them. (As opposed to, for example, being "
      "placed in a library that may be linked in to get other utilities.)";

  const char kMissingTestCase[] =  //
      " is instantiated via INSTANTIATE_TEST_SUITE_P, but no tests are "
      "defined via TEST_P . No test cases will run."
      "\n\n"
      "Ideally, INSTANTIATE_TEST_SUITE_P should only ever be invoked from "
      "code that always depend on code that provides TEST_P. Failing to do "
      "so is often an indication of dead code, e.g. the last TEST_P was "
      "removed but the rest got left behind.";

  std::string message =
      "Parameterized test suite " + name +
      (has_test_p ? kMissingInstantiation : kMissingTestCase) +
      "\n\n"
      "To suppress this error for this test suite, insert the following line "
      "(in a non-header) in the namespace it is defined in:"
      "\n\n"
      "GTEST_ALLOW_UNINSTANTIATED_PARAMETERIZED_TEST(" +
      name + ");";

  std::string full_name = "UninstantiatedParameterizedTestSuite<" + name + ">";
  RegisterTest(  //
      "GoogleTestVerification", full_name.c_str(),
      nullptr,  // No type parameter.
      nullptr,  // No value parameter.
      location.file.c_str(), location.line, [message, location] {
        return new FailureTest(location, message,
                               kErrorOnUninstantiatedParameterizedTest);
      });
}